

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::PatchVertexCountCase::init
          (PatchVertexCountCase *this,EVP_PKEY_CTX *ctx)

{
  deInt32 *pdVar1;
  size_type *psVar2;
  pointer pbVar3;
  Context *this_00;
  RenderContext *renderCtx;
  SharedPtrStateBase *pSVar4;
  ShaderProgram *this_01;
  RenderTarget *renderTarget;
  long *plVar5;
  SharedPtrStateBase *pSVar6;
  long *extraout_RAX;
  TestError *this_02;
  undefined1 usePointMode;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  size_type *psVar8;
  size_type *psVar9;
  pointer pbVar10;
  ContextInfo *pCVar11;
  Context *code;
  TessPrimitiveType extraout_EDX;
  TessPrimitiveType extraout_EDX_00;
  TessPrimitiveType extraout_EDX_01;
  TessPrimitiveType extraout_EDX_02;
  TessPrimitiveType primType;
  long extraout_RDX;
  long lVar12;
  string tessellationEvaluationTemplate;
  string tessellationControlTemplate;
  string outSizeStr;
  string fragmentShaderTemplate;
  string vertexShaderTemplate;
  string inSizeStr;
  size_type *local_390;
  value_type local_388;
  size_type *local_368;
  value_type local_360;
  undefined1 local_340 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  ShaderProgram *local_318;
  Context *local_310;
  long local_308;
  Context local_300;
  long local_2e8;
  undefined1 local_2e0 [20];
  undefined4 uStack_2cc;
  value_type local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  Context *local_288 [2];
  undefined1 local_278 [16];
  ContextInfo *local_268;
  undefined1 local_258 [24];
  pointer local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  string local_228;
  string local_208;
  string local_1e8;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [24];
  pointer pbStack_190;
  ios_base local_138 [32];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_118;
  undefined1 local_f8 [200];
  
  checkTessellationSupport((this->super_TestCase).m_context);
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x100);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<((ostringstream *)local_1a8,this->m_inputPatchSize);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,this->m_outputPatchSize);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  local_268 = (ContextInfo *)local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,
             "${GLSL_VERSION_DECL}\n\nin highp float in_v_attr;\n\nout highp float in_tc_attr;\n\nvoid main (void)\n{\n\tin_tc_attr = in_v_attr;\n}\n"
             ,"");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_2e0 + 0x10),
                 "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = ",
                 &local_2a8);
  plVar5 = (long *)std::__cxx11::string::append(local_2e0 + 0x10);
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar7) {
    local_330._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_330._8_8_ = plVar5[3];
    local_340._0_8_ = &local_330;
  }
  else {
    local_330._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_340._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar5;
  }
  local_340._8_8_ = plVar5[1];
  *plVar5 = (long)paVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append(local_340,(ulong)local_1c8);
  psVar2 = &local_360._M_string_length;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar8) {
    local_360._M_string_length = *psVar8;
    local_360.field_2._M_allocated_capacity = plVar5[3];
    local_368 = psVar2;
  }
  else {
    local_360._M_string_length = *psVar8;
    local_368 = (size_type *)*plVar5;
  }
  local_360._M_dataplus._M_p = (pointer)plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_368);
  psVar8 = &local_388._M_string_length;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar9) {
    local_388._M_string_length = *psVar9;
    local_388.field_2._M_allocated_capacity = plVar5[3];
    local_390 = psVar8;
  }
  else {
    local_388._M_string_length = *psVar9;
    local_390 = (size_type *)*plVar5;
  }
  local_388._M_dataplus._M_p = (pointer)plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_390,(ulong)local_2a8._M_dataplus._M_p);
  pbVar3 = (pointer)(local_1a8 + 0x10);
  pbVar10 = (pointer)(plVar5 + 2);
  if ((pointer)*plVar5 == pbVar10) {
    local_1a8._16_8_ = (pbVar10->_M_dataplus)._M_p;
    pbStack_190 = (pointer)plVar5[3];
    local_1a8._0_8_ = pbVar3;
  }
  else {
    local_1a8._16_8_ = (pbVar10->_M_dataplus)._M_p;
    local_1a8._0_8_ = (pointer)*plVar5;
  }
  local_1a8._8_8_ = plVar5[1];
  *plVar5 = (long)pbVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append(local_1a8);
  local_300.m_contextInfo = (ContextInfo *)local_2e0;
  pCVar11 = (ContextInfo *)(plVar5 + 2);
  if ((ContextInfo *)*plVar5 == pCVar11) {
    local_2e0._0_8_ = pCVar11->_vptr_ContextInfo;
    local_2e0._8_8_ = plVar5[3];
  }
  else {
    local_2e0._0_8_ = pCVar11->_vptr_ContextInfo;
    local_300.m_contextInfo = (ContextInfo *)*plVar5;
  }
  lVar12 = plVar5[1];
  *plVar5 = (long)pCVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_2e8 = lVar12;
  if ((pointer)local_1a8._0_8_ != pbVar3) {
    operator_delete((void *)local_1a8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_1a8._16_8_)->_M_p + 1));
    lVar12 = extraout_RDX;
  }
  usePointMode = SUB81(pCVar11,0);
  primType = (TessPrimitiveType)lVar12;
  if (local_390 != psVar8) {
    operator_delete(local_390,local_388._M_string_length + 1);
    primType = extraout_EDX;
  }
  if (local_368 != psVar2) {
    operator_delete(local_368,local_360._M_string_length + 1);
    primType = extraout_EDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._0_8_ != &local_330) {
    operator_delete((void *)local_340._0_8_,local_330._M_allocated_capacity + 1);
    primType = extraout_EDX_01;
  }
  if ((size_type *)CONCAT44(uStack_2cc,local_2e0._16_4_) != &local_2c8._M_string_length) {
    operator_delete((undefined1 *)CONCAT44(uStack_2cc,local_2e0._16_4_),
                    (ulong)((long)&((_Alloc_hider *)local_2c8._M_string_length)->_M_p + 1));
    primType = extraout_EDX_02;
  }
  Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            ((string *)local_340,(_anonymous_namespace_ *)&DAT_00000001,primType,(bool)usePointMode)
  ;
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_340,0,(char *)0x0,0x1c880bf);
  psVar9 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar9) {
    local_360._M_string_length = *psVar9;
    local_360.field_2._M_allocated_capacity = plVar5[3];
    local_368 = psVar2;
  }
  else {
    local_360._M_string_length = *psVar9;
    local_368 = (size_type *)*plVar5;
  }
  local_360._M_dataplus._M_p = (pointer)plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_368);
  psVar9 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar9) {
    local_388._M_string_length = *psVar9;
    local_388.field_2._M_allocated_capacity = plVar5[3];
    local_390 = psVar8;
  }
  else {
    local_388._M_string_length = *psVar9;
    local_390 = (size_type *)*plVar5;
  }
  local_388._M_dataplus._M_p = (pointer)plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_390,(ulong)local_2a8._M_dataplus._M_p);
  pbVar10 = (pointer)(plVar5 + 2);
  if ((pointer)*plVar5 == pbVar10) {
    local_1a8._16_8_ = (pbVar10->_M_dataplus)._M_p;
    pbStack_190 = (pointer)plVar5[3];
    local_1a8._0_8_ = pbVar3;
  }
  else {
    local_1a8._16_8_ = (pbVar10->_M_dataplus)._M_p;
    local_1a8._0_8_ = (pointer)*plVar5;
  }
  local_1a8._8_8_ = plVar5[1];
  *plVar5 = (long)pbVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append(local_1a8);
  local_310 = &local_300;
  code = (Context *)(plVar5 + 2);
  if ((Context *)*plVar5 == code) {
    local_300.m_testCtx = code->m_testCtx;
    local_300.m_renderCtx = (RenderContext *)plVar5[3];
  }
  else {
    local_300.m_testCtx = code->m_testCtx;
    local_310 = (Context *)*plVar5;
  }
  local_308 = plVar5[1];
  *plVar5 = (long)code;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((pointer)local_1a8._0_8_ != pbVar3) {
    operator_delete((void *)local_1a8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_1a8._16_8_)->_M_p + 1));
  }
  if (local_390 != psVar8) {
    operator_delete(local_390,local_388._M_string_length + 1);
  }
  if (local_368 != psVar2) {
    operator_delete(local_368,local_360._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._0_8_ != &local_330) {
    operator_delete((void *)local_340._0_8_,local_330._M_allocated_capacity + 1);
  }
  local_288[0] = (Context *)local_278;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_288,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin mediump vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
             ,"");
  local_318 = (ShaderProgram *)operator_new(0xd0);
  this_00 = (this->super_TestCase).m_context;
  renderCtx = this_00->m_renderCtx;
  local_f8[0x10] = 0;
  local_f8._17_8_ = 0;
  local_f8._0_8_ = (pointer)0x0;
  local_f8[8] = 0;
  local_f8._9_7_ = 0;
  memset(local_1a8,0,0xac);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_1e8,(_anonymous_namespace_ *)this_00,(Context *)local_268,(char *)code);
  local_390 = (size_type *)((ulong)local_390 & 0xffffffff00000000);
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_388,local_1e8._M_dataplus._M_p,
             local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1a8 + ((ulong)local_390 & 0xffffffff) * 0x18),&local_388);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_208,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)local_300.m_contextInfo,(char *)code);
  local_368 = (size_type *)CONCAT44(local_368._4_4_,3);
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_360,local_208._M_dataplus._M_p,
             local_208._M_dataplus._M_p + local_208._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1a8 + ((ulong)local_368 & 0xffffffff) * 0x18),&local_360);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_228,(_anonymous_namespace_ *)(this->super_TestCase).m_context,local_310,
             (char *)code);
  local_340._0_4_ = 4;
  local_340._8_8_ = local_330._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_340 + 8),local_228._M_dataplus._M_p,
             local_228._M_dataplus._M_p + local_228._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1a8 + (local_340._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_340 + 8));
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)(local_258 + 0x10),(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             local_288[0],(char *)code);
  local_2e0._16_4_ = 1;
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c8,local_258._16_8_,
             (char *)(local_258._16_8_ + (long)&local_240->_M_dataplus));
  this_01 = local_318;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1a8 + (ulong)(uint)local_2e0._16_4_ * 0x18),&local_2c8);
  glu::ShaderProgram::ShaderProgram(this_01,renderCtx,(ProgramSources *)local_1a8);
  pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar6->strongRefCount = 0;
  pSVar6->weakRefCount = 0;
  pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0217e258;
  pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)this_01;
  pSVar6->strongRefCount = 1;
  pSVar6->weakRefCount = 1;
  pSVar4 = (this->m_program).m_state;
  if (pSVar4 != pSVar6) {
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar4->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_program).m_ptr = (ShaderProgram *)0x0;
        (*((this->m_program).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_program).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar4 = (this->m_program).m_state;
        if (pSVar4 != (SharedPtrStateBase *)0x0) {
          (*pSVar4->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_program).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_program).m_ptr = this_01;
    (this->m_program).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_program).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  LOCK();
  pdVar1 = &pSVar6->strongRefCount;
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar6->_vptr_SharedPtrStateBase[2])(pSVar6);
  }
  LOCK();
  pdVar1 = &pSVar6->weakRefCount;
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar6->_vptr_SharedPtrStateBase[1])(pSVar6);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._16_8_ != &local_238) {
    operator_delete((void *)local_258._16_8_,local_238._M_allocated_capacity + 1);
  }
  if ((char *)local_340._8_8_ != local_330._M_local_buf + 8) {
    operator_delete((void *)local_340._8_8_,local_330._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_f8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_118);
  lVar12 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1a8 + lVar12));
    lVar12 = lVar12 + -0x18;
  } while (lVar12 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).m_ptr);
  if ((((this->m_program).m_ptr)->m_program).m_info.linkOk != false) {
    if (local_288[0] != (Context *)local_278) {
      operator_delete(local_288[0],(ulong)((long)(Platform **)local_278._0_8_ + 1));
    }
    if (local_310 != &local_300) {
      operator_delete(local_310,(ulong)((long)&(local_300.m_testCtx)->m_platform + 1));
    }
    if (local_300.m_contextInfo != (ContextInfo *)local_2e0) {
      operator_delete(local_300.m_contextInfo,(ulong)((long)(Platform **)local_2e0._0_8_ + 1));
    }
    if (local_268 != (ContextInfo *)local_258) {
      operator_delete(local_268,(ulong)((long)(Platform **)local_258._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    plVar5 = local_1b8;
    if (local_1c8 != plVar5) {
      operator_delete(local_1c8,local_1b8[0] + 1);
      plVar5 = extraout_RAX;
    }
    return (int)plVar5;
  }
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
             ,0xbb2);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void PatchVertexCountCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	const string inSizeStr		= de::toString(m_inputPatchSize);
	const string outSizeStr		= de::toString(m_outputPatchSize);

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "in highp float in_v_attr;\n"
													 "\n"
													 "out highp float in_tc_attr;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	in_tc_attr = in_v_attr;\n"
												 "}\n");
	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 "layout (vertices = " + outSizeStr + ") out;\n"
													 "\n"
													 "in highp float in_tc_attr[];\n"
													 "\n"
													 "out highp float in_te_attr[];\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	in_te_attr[gl_InvocationID] = in_tc_attr[gl_InvocationID*" + inSizeStr + "/" + outSizeStr + "];\n"
													 "\n"
													 "	gl_TessLevelInner[0] = 5.0;\n"
													 "	gl_TessLevelInner[1] = 5.0;\n"
													 "\n"
													"	gl_TessLevelOuter[0] = 5.0;\n"
													"	gl_TessLevelOuter[1] = 5.0;\n"
													"	gl_TessLevelOuter[2] = 5.0;\n"
													"	gl_TessLevelOuter[3] = 5.0;\n"
												 "}\n");
	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 + getTessellationEvaluationInLayoutString(TESSPRIMITIVETYPE_QUADS) +
													 "\n"
													 "in highp float in_te_attr[];\n"
													 "\n"
													 "out mediump vec4 in_f_color;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	highp float x = gl_TessCoord.x*2.0 - 1.0;\n"
													 "	highp float y = gl_TessCoord.y - in_te_attr[int(round(gl_TessCoord.x*float(" + outSizeStr + "-1)))];\n"
													 "	gl_Position = vec4(x, y, 0.0, 1.0);\n"
													 "	in_f_color = vec4(1.0);\n"
												 "}\n");
	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "layout (location = 0) out mediump vec4 o_color;\n"
													 "\n"
													 "in mediump vec4 in_f_color;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	o_color = in_f_color;\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
			<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
			<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
			<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}